

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_chain_free(llama_sampler *smpl)

{
  bool bVar1;
  reference pplVar2;
  long in_RDI;
  llama_sampler *smpl_1;
  iterator __end1;
  iterator __begin1;
  vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *__range1;
  llama_sampler_chain *chain;
  vector<llama_sampler_*,_std::allocator<llama_sampler_*>_> *in_stack_ffffffffffffffc8;
  void *pvVar3;
  llama_sampler *in_stack_ffffffffffffffd0;
  __normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
  local_20;
  long local_18;
  void *local_10;
  
  local_10 = *(void **)(in_RDI + 8);
  local_18 = (long)local_10 + 8;
  local_20._M_current =
       (llama_sampler **)
       std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    pplVar2 = __gnu_cxx::
              __normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *pplVar2;
    llama_sampler_free(in_stack_ffffffffffffffd0);
    __gnu_cxx::
    __normal_iterator<llama_sampler_**,_std::vector<llama_sampler_*,_std::allocator<llama_sampler_*>_>_>
    ::operator++(&local_20);
  }
  if (local_10 != (void *)0x0) {
    pvVar3 = local_10;
    llama_sampler_chain::~llama_sampler_chain((llama_sampler_chain *)0x5198d8);
    operator_delete(pvVar3,0x30);
  }
  return;
}

Assistant:

static void llama_sampler_chain_free(struct llama_sampler * smpl) {
    auto * chain = (llama_sampler_chain *) smpl->ctx;

    for (auto * smpl : chain->samplers) {
        llama_sampler_free(smpl);
    }

    delete chain;
}